

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::_unknownCommandHandler(Server *this,Pointer *client,string *command)

{
  ostream *poVar1;
  type pCVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Unknown command \"");
  poVar1 = std::operator<<(poVar1,(string *)command);
  poVar1 = std::operator<<(poVar1,"\" issued by ");
  pCVar2 = boost::shared_ptr<ClientConnection>::operator->(client);
  poVar1 = std::operator<<(poVar1,(string *)&pCVar2->m_clientName);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void _unknownCommandHandler( ClientConnection::Pointer client, const string& command ){
        cerr << "Unknown command \"" << command << "\" issued by " << client->getName() << endl;
    }